

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O3

void helics::valueExtract(defV *data,char *val)

{
  double *pdVar1;
  char cVar2;
  variant_alternative_t<3UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar3;
  variant_alternative_t<6UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar4;
  variant_alternative_t<1UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar5;
  variant_alternative_t<2UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar6;
  variant_alternative_t<4UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
  *pvVar7;
  double dVar8;
  string_view val_00;
  
  switch((data->
         super__Variant_base<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
         ).
         super__Move_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Copy_assign_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Move_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Copy_ctor_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         .
         super__Variant_storage_alias<double,_long,_std::__cxx11::basic_string<char>,_std::complex<double>,_std::vector<double>,_std::vector<std::complex<double>_>,_helics::NamedPoint>
         ._M_index) {
  case '\0':
    pvVar3 = (variant_alternative_t<3UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
              *)std::
                get<0ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                          (data);
    break;
  default:
    pvVar5 = std::
             get<1ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
LAB_00216c17:
    cVar2 = (char)*pvVar5;
    goto LAB_00216c5f;
  case '\x02':
    pvVar6 = std::
             get<2ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    if (pvVar6->_M_string_length != 0) {
      pvVar5 = (variant_alternative_t<1UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
                *)(pvVar6->_M_dataplus)._M_p;
      goto LAB_00216c17;
    }
    goto LAB_00216c5d;
  case '\x03':
    pvVar3 = std::
             get<3ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    break;
  case '\x04':
    pvVar7 = std::
             get<4ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    goto LAB_00216c27;
  case '\x05':
    pvVar7 = (variant_alternative_t<4UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
              *)std::
                get<5ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                          (data);
LAB_00216c27:
    pdVar1 = (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (pdVar1 == (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
LAB_00216c5d:
      cVar2 = '\0';
    }
    else {
      cVar2 = (char)(int)*pdVar1;
    }
    goto LAB_00216c5f;
  case '\x06':
    pvVar4 = std::
             get<6ul,double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
                       (data);
    dVar8 = pvVar4->value;
    if (NAN(dVar8)) {
      val_00._M_str = (pvVar4->name)._M_dataplus._M_p;
      val_00._M_len = (pvVar4->name)._M_string_length;
      dVar8 = getDoubleFromString(val_00);
      if ((dVar8 == -1e+49) && (!NAN(dVar8))) {
        if ((pvVar4->name)._M_string_length == 0) goto LAB_00216c5d;
        pvVar5 = (variant_alternative_t<1UL,_variant<double,_long,_basic_string<char,_char_traits<char>,_allocator<char>_>,_complex<double>,_vector<double,_allocator<double>_>,_vector<complex<double>,_allocator<complex<double>_>_>,_NamedPoint>_>
                  *)(pvVar4->name)._M_dataplus._M_p;
        goto LAB_00216c17;
      }
    }
    cVar2 = (char)(int)dVar8;
    goto LAB_00216c5f;
  }
  cVar2 = (char)(int)*(double *)pvVar3->_M_value;
LAB_00216c5f:
  *val = cVar2;
  return;
}

Assistant:

void valueExtract(const defV& data, char& val)
{
    switch (data.index()) {
        case double_loc:  // double
            val = static_cast<char>(std::get<double>(data));
            break;
        case int_loc:  // int64_t
        default:
            val = static_cast<char>(std::get<int64_t>(data));
            break;
        case string_loc:  // string
        {
            const auto& str = std::get<std::string>(data);
            val = (str.empty()) ? '\0' : str[0];
            break;
        }
        case complex_loc:  // complex
            val = static_cast<char>(std::get<std::complex<double>>(data).real());
            break;
        case vector_loc:  // vector
        {
            const auto& vec = std::get<std::vector<double>>(data);
            val = (!vec.empty()) ? static_cast<char>(vec[0]) : '\0';
            break;
        }
        case complex_vector_loc: {
            const auto& vec = std::get<std::vector<std::complex<double>>>(data);
            val = (!vec.empty()) ? static_cast<char>(vec[0].real()) : '\0';
            break;
        }
        case named_point_loc: {
            const auto& point = std::get<NamedPoint>(data);
            if (std::isnan(point.value)) {
                const double vald = getDoubleFromString(point.name);
                if (vald != invalidDouble) {
                    val = static_cast<char>(vald);
                } else {
                    val = !point.name.empty() ? point.name[0] : 0;
                }
            } else {
                val = static_cast<char>(point.value);
            }
        } break;
    }
}